

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
::redux<Eigen::internal::scalar_max_op<float,float,1>>
          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
           *this,scalar_max_op<float,_float,_1> *func)

{
  Scalar SVar1;
  ThisEvaluator thisEval;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
  local_10;
  
  local_10.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
  .m_d.argImpl.super_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data =
       *(evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this;
  SVar1 = internal::
          redux_impl<Eigen::internal::scalar_max_op<float,float,1>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>,3,2>
          ::
          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
                    (&local_10,func,
                     (CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                      *)this);
  return SVar1;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}